

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MergedDescriptorDatabaseTest_FindAllExtensionNumbers_Test::
~MergedDescriptorDatabaseTest_FindAllExtensionNumbers_Test
          (MergedDescriptorDatabaseTest_FindAllExtensionNumbers_Test *this)

{
  (this->super_MergedDescriptorDatabaseTest).super_Test._vptr_Test =
       (_func_int **)&PTR__MergedDescriptorDatabaseTest_01876228;
  MergedDescriptorDatabase::~MergedDescriptorDatabase
            (&(this->super_MergedDescriptorDatabaseTest).reverse_merged_);
  MergedDescriptorDatabase::~MergedDescriptorDatabase
            (&(this->super_MergedDescriptorDatabaseTest).forward_merged_);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase
            (&(this->super_MergedDescriptorDatabaseTest).database2_);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase
            (&(this->super_MergedDescriptorDatabaseTest).database1_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x120);
  return;
}

Assistant:

TEST_F(MergedDescriptorDatabaseTest, FindAllExtensionNumbers) {
  {
    // Message only has extension in database1_
    std::vector<int> numbers;
    EXPECT_TRUE(forward_merged_.FindAllExtensionNumbers("Foo", &numbers));
    ASSERT_EQ(1, numbers.size());
    EXPECT_EQ(3, numbers[0]);
  }

  {
    // Message only has extension in database2_
    std::vector<int> numbers;
    EXPECT_TRUE(forward_merged_.FindAllExtensionNumbers("Bar", &numbers));
    ASSERT_EQ(1, numbers.size());
    EXPECT_EQ(5, numbers[0]);
  }

  {
    // Merge results from the two databases.
    std::vector<int> numbers;
    EXPECT_TRUE(forward_merged_.FindAllExtensionNumbers("Baz", &numbers));
    ASSERT_EQ(2, numbers.size());
    std::sort(numbers.begin(), numbers.end());
    EXPECT_EQ(12, numbers[0]);
    EXPECT_EQ(13, numbers[1]);
  }

  {
    std::vector<int> numbers;
    EXPECT_TRUE(reverse_merged_.FindAllExtensionNumbers("Baz", &numbers));
    ASSERT_EQ(2, numbers.size());
    std::sort(numbers.begin(), numbers.end());
    EXPECT_EQ(12, numbers[0]);
    EXPECT_EQ(13, numbers[1]);
  }

  {
    // Can't find extensions for a non-existent message.
    std::vector<int> numbers;
    EXPECT_FALSE(reverse_merged_.FindAllExtensionNumbers("Blah", &numbers));
  }
}